

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>
::DrawTestCase(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this,
              TestContext *context,char *name,char *desc,DrawIndexedIndirectParams *data)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"vkCmdDrawIndexedIndirect testcase.",&local_6a);
  TestCase::TestCase(&this->super_TestCase,context,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawTestCase_00bd82a0;
  DrawIndexedIndirectParams::DrawIndexedIndirectParams
            (&this->m_data,(DrawIndexedIndirectParams *)desc);
  (this->m_vertShaderSource)._M_dataplus._M_p = (pointer)&(this->m_vertShaderSource).field_2;
  (this->m_vertShaderSource)._M_string_length = 0;
  (this->m_vertShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragShaderSource)._M_dataplus._M_p = (pointer)&(this->m_fragShaderSource).field_2;
  (this->m_fragShaderSource)._M_string_length = 0;
  (this->m_fragShaderSource).field_2._M_local_buf[0] = '\0';
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  return;
}

Assistant:

DrawTestCase<T>::DrawTestCase (tcu::TestContext& context, const char* name, const char* desc, const T data)
	: vkt::TestCase	(context, name, desc)
	, m_data		(data)
{
	initShaderSources();
}